

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O1

int lfilter(lua_State *L)

{
  ushort uVar1;
  int *piVar2;
  lua_Integer lVar3;
  queue *q;
  uncomplete *puVar4;
  byte *buffer;
  ushort *s;
  uint size;
  size_t __n;
  ushort *puVar5;
  ulong uVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  piVar2 = (int *)lua_touserdata(L,2);
  lVar3 = luaL_checkinteger(L,3);
  puVar5 = *(ushort **)(piVar2 + 4);
  s = (ushort *)(piVar2 + 6);
  if (puVar5 != (ushort *)0x0) {
    s = puVar5;
  }
  iVar9 = 1;
  lua_settop(L,1);
  if (6 < *piVar2 - 1U) {
    return 1;
  }
  uVar8 = -(uint)(puVar5 != (ushort *)0x0) | (int)lVar3 - 0x18U;
  switch(*piVar2) {
  case 1:
    if (uVar8 != 0xffffffff) {
      __assert_fail("size == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                    ,0x160,"int lfilter(lua_State *)");
    }
    uVar8 = piVar2[1];
    iVar9 = piVar2[2];
    q = (queue *)lua_touserdata(L,1);
    puVar4 = find_uncomplete(q,uVar8);
    if (puVar4 == (uncomplete *)0x0) {
      if (iVar9 == 1) {
        puVar4 = save_uncomplete(L,uVar8);
        puVar4->read = -1;
        puVar4->header = (uint)(byte)*s;
      }
      else {
        uVar1 = *s << 8 | *s >> 8;
        puVar5 = s + 1;
        uVar6 = (long)iVar9 - 2;
        iVar10 = (int)uVar6;
        iVar9 = iVar10 - (uint)uVar1;
        size = (uint)uVar1;
        if ((int)(uint)uVar1 <= iVar10) {
          if (iVar9 != 0) {
            push_data(L,uVar8,puVar5,size,1);
            buffer = (byte *)((ulong)size + (long)puVar5);
            goto LAB_00120e04;
          }
          lua_pushvalue(L,-0xf4629);
          lua_pushinteger(L,(long)(int)uVar8);
          pvVar7 = malloc((ulong)(uint)uVar1);
          memcpy(pvVar7,puVar5,uVar6 & 0xffffffff);
          lua_pushlightuserdata(L,pvVar7);
          lua_pushinteger(L,uVar6 & 0xffffffff);
          goto LAB_00120ddc;
        }
        puVar4 = save_uncomplete(L,uVar8);
        puVar4->read = iVar10;
        (puVar4->pack).size = (uint)uVar1;
        pvVar7 = malloc((ulong)size);
        (puVar4->pack).buffer = pvVar7;
        memcpy(pvVar7,puVar5,uVar6);
      }
LAB_00120d46:
      iVar9 = 1;
    }
    else {
      puVar5 = s;
      if (puVar4->read < 0) {
        if (puVar4->read != -1) {
          __assert_fail("uc->read == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                        ,0xe9,"int filter_data_(lua_State *, int, uint8_t *, int)");
        }
        uVar6 = (long)(puVar4->header << 8) | (ulong)(byte)*s;
        iVar9 = iVar9 + -1;
        (puVar4->pack).size = (int)uVar6;
        pvVar7 = malloc(uVar6);
        (puVar4->pack).buffer = pvVar7;
        puVar4->read = 0;
        puVar5 = (ushort *)((long)s + 1);
      }
      __n = (long)(puVar4->pack).size - (long)puVar4->read;
      pvVar7 = (void *)((long)puVar4->read + (long)(puVar4->pack).buffer);
      if (iVar9 < (int)__n) {
        memcpy(pvVar7,puVar5,(long)iVar9);
        puVar4->read = puVar4->read + iVar9;
        uVar8 = ((int)uVar8 >> 0x18) + (uVar8 >> 0xc) + uVar8 & 0xfff;
        puVar4->next = q->hash[uVar8];
        q->hash[uVar8] = puVar4;
        goto LAB_00120d46;
      }
      memcpy(pvVar7,puVar5,__n);
      iVar9 = iVar9 - (int)__n;
      if (iVar9 == 0) {
        lua_pushvalue(L,-0xf4629);
        lua_pushinteger(L,(long)(int)uVar8);
        lua_pushlightuserdata(L,(puVar4->pack).buffer);
        lua_pushinteger(L,(long)(puVar4->pack).size);
        free(puVar4);
LAB_00120ddc:
        iVar9 = 5;
      }
      else {
        buffer = (byte *)((long)puVar5 + __n);
        push_data(L,uVar8,(puVar4->pack).buffer,(puVar4->pack).size,0);
        free(puVar4);
LAB_00120e04:
        push_more(L,uVar8,buffer,iVar9);
        lua_pushvalue(L,-0xf462a);
        iVar9 = 2;
      }
    }
    free(s);
    break;
  case 3:
    close_uncomplete(L,piVar2[1]);
    lua_pushvalue(L,-0xf462d);
    lua_pushinteger(L,(long)piVar2[1]);
    iVar9 = 3;
    break;
  case 4:
    lua_pushvalue(L,-0xf462c);
    iVar9 = piVar2[2];
    goto LAB_00120ba3;
  case 5:
    close_uncomplete(L,piVar2[1]);
    lua_pushvalue(L,-0xf462b);
    iVar9 = piVar2[1];
LAB_00120ba3:
    lua_pushinteger(L,(long)iVar9);
    lua_pushlstring(L,(char *)s,(long)(int)uVar8);
LAB_00120be0:
    iVar9 = 4;
    break;
  case 7:
    lua_pushvalue(L,-0xf462e);
    lua_pushinteger(L,(long)piVar2[1]);
    lua_pushinteger(L,(long)piVar2[2]);
    goto LAB_00120be0;
  }
  return iVar9;
}

Assistant:

static int
lfilter(lua_State *L) {
	struct skynet_socket_message *message = lua_touserdata(L,2);
	int size = luaL_checkinteger(L,3);
	char * buffer = message->buffer;
	if (buffer == NULL) {
		buffer = (char *)(message+1);
		size -= sizeof(*message);
	} else {
		size = -1;
	}

	lua_settop(L, 1);

	switch(message->type) {
	case SKYNET_SOCKET_TYPE_DATA:
		// ignore listen id (message->id)
		assert(size == -1);	// never padding string
		return filter_data(L, message->id, (uint8_t *)buffer, message->ud);
	case SKYNET_SOCKET_TYPE_CONNECT:
		// ignore listen fd connect
		return 1;
	case SKYNET_SOCKET_TYPE_CLOSE:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_CLOSE));
		lua_pushinteger(L, message->id);
		return 3;
	case SKYNET_SOCKET_TYPE_ACCEPT:
		lua_pushvalue(L, lua_upvalueindex(TYPE_OPEN));
		// ignore listen id (message->id);
		lua_pushinteger(L, message->ud);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_ERROR:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_ERROR));
		lua_pushinteger(L, message->id);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_WARNING:
		lua_pushvalue(L, lua_upvalueindex(TYPE_WARNING));
		lua_pushinteger(L, message->id);
		lua_pushinteger(L, message->ud);
		return 4;
	default:
		// never get here
		return 1;
	}
}